

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O1

void bcf_enc_int1(kstring_t *s,int32_t x)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  int32_t z;
  
  if (x == -0x7fffffff) {
    uVar1 = s->l + 1;
    if (uVar1 < s->m) {
LAB_0011c21b:
      sVar3 = s->l;
      s->l = sVar3 + 1;
      s->s[sVar3] = '\x11';
      s->s[s->l] = '\0';
    }
    else {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 != (char *)0x0) {
        s->s = pcVar2;
        goto LAB_0011c21b;
      }
    }
    uVar1 = s->l + 1;
    if (s->m <= uVar1) {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 == (char *)0x0) {
        return;
      }
      s->s = pcVar2;
    }
    sVar3 = s->l;
    s->l = sVar3 + 1;
    s->s[sVar3] = -0x7f;
  }
  else {
    if (0xfe < x + 0x7fU) {
      if (x + 0x7fffU < 0xffff) {
        uVar1 = s->l + 1;
        if (uVar1 < s->m) {
LAB_0011c4f1:
          sVar3 = s->l;
          s->l = sVar3 + 1;
          s->s[sVar3] = '\x12';
          s->s[s->l] = '\0';
        }
        else {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 != (char *)0x0) {
            s->s = pcVar2;
            goto LAB_0011c4f1;
          }
        }
        uVar1 = s->l + 3;
        if (s->m <= uVar1) {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 == (char *)0x0) {
            return;
          }
          s->s = pcVar2;
        }
        *(short *)(s->s + s->l) = (short)x;
        sVar3 = s->l + 2;
      }
      else {
        uVar1 = s->l + 1;
        if (uVar1 < s->m) {
LAB_0011c5d7:
          sVar3 = s->l;
          s->l = sVar3 + 1;
          s->s[sVar3] = '\x13';
          s->s[s->l] = '\0';
        }
        else {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 != (char *)0x0) {
            s->s = pcVar2;
            goto LAB_0011c5d7;
          }
        }
        uVar1 = s->l + 5;
        if (s->m <= uVar1) {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 == (char *)0x0) {
            return;
          }
          s->s = pcVar2;
        }
        *(int32_t *)(s->s + s->l) = x;
        sVar3 = s->l + 4;
      }
      s->l = sVar3;
      pcVar2 = s->s + sVar3;
      goto LAB_0011c47e;
    }
    uVar1 = s->l + 1;
    if (uVar1 < s->m) {
LAB_0011c3f2:
      sVar3 = s->l;
      s->l = sVar3 + 1;
      s->s[sVar3] = '\x11';
      s->s[s->l] = '\0';
    }
    else {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 != (char *)0x0) {
        s->s = pcVar2;
        goto LAB_0011c3f2;
      }
    }
    uVar1 = s->l + 1;
    if (s->m <= uVar1) {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 == (char *)0x0) {
        return;
      }
      s->s = pcVar2;
    }
    sVar3 = s->l;
    s->l = sVar3 + 1;
    s->s[sVar3] = (char)x;
  }
  pcVar2 = s->s + s->l;
LAB_0011c47e:
  *pcVar2 = '\0';
  return;
}

Assistant:

static inline void bcf_enc_int1(kstring_t *s, int32_t x)
{
    if (x == bcf_int32_vector_end) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(bcf_int8_vector_end, s);
    } else if (x == bcf_int32_missing) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(bcf_int8_missing, s);
    } else if (x <= INT8_MAX && x > bcf_int8_missing) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(x, s);
    } else if (x <= INT16_MAX && x > bcf_int16_missing) {
        int16_t z = x;
        bcf_enc_size(s, 1, BCF_BT_INT16);
        kputsn((char*)&z, 2, s);
    } else {
        int32_t z = x;
        bcf_enc_size(s, 1, BCF_BT_INT32);
        kputsn((char*)&z, 4, s);
    }
}